

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O2

void __thiscall
QNetworkReplyHttpImpl::QNetworkReplyHttpImpl
          (QNetworkReplyHttpImpl *this,QNetworkAccessManager *manager,QNetworkRequest *request,
          Operation *operation,QIODevice *outgoingData)

{
  QVariant *this_00;
  QSharedDataPointer<QNetworkRequestPrivate> QVar1;
  bool bVar2;
  char cVar3;
  QNetworkReplyHttpImplPrivate *pQVar4;
  QSslConfiguration *other;
  char *member;
  qint64 qVar5;
  element_type *peVar6;
  long in_FS_OFFSET;
  QByteArrayView QVar7;
  optional<long_long> oVar8;
  QByteArrayView value;
  undefined1 local_a0 [8];
  QVariant local_98;
  undefined1 local_78 [24];
  undefined8 local_60;
  code *local_58 [3];
  undefined1 *puStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = (QNetworkReplyHttpImplPrivate *)operator_new(0x448);
  QNetworkReplyHttpImplPrivate::QNetworkReplyHttpImplPrivate(pQVar4);
  QNetworkReply::QNetworkReply
            ((QNetworkReply *)this,(QNetworkReplyPrivate *)pQVar4,&manager->super_QObject);
  *(undefined ***)this = &PTR_metaObject_002ce0f0;
  pQVar4 = *(QNetworkReplyHttpImplPrivate **)(this + 8);
  pQVar4->manager = manager;
  pQVar4->managerPrivate = *(QNetworkAccessManagerPrivate **)&manager->field_0x8;
  QNetworkRequest::operator=(&(pQVar4->super_QNetworkReplyPrivate).request,request);
  QNetworkRequest::operator=(&(pQVar4->super_QNetworkReplyPrivate).originalRequest,request);
  (pQVar4->super_QNetworkReplyPrivate).operation = *operation;
  pQVar4->outgoingData = outgoingData;
  QNetworkRequest::url((QNetworkRequest *)local_58);
  QVar1.d.ptr = (totally_ordered_wrapper<QNetworkRequestPrivate_*>)
                (pQVar4->super_QNetworkReplyPrivate).url.d;
  (pQVar4->super_QNetworkReplyPrivate).url.d = (QUrlPrivate *)local_58[0];
  local_58[0] = (code *)QVar1.d.ptr;
  QUrl::~QUrl((QUrl *)local_58);
  QNetworkRequest::url((QNetworkRequest *)(local_a0 + 8));
  QUrl::scheme();
  local_78._0_8_ = 2.47032822920623e-323;
  local_78._8_8_ = (long)"preconnect-https" + 0xb;
  bVar2 = ::operator==((QString *)local_58,(QLatin1StringView *)local_78);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)local_58);
  QUrl::~QUrl((QUrl *)(local_a0 + 8));
  if (bVar2) {
    other = (QSslConfiguration *)operator_new(8);
    QNetworkRequest::sslConfiguration((QNetworkRequest *)other);
    QScopedPointer<QSslConfiguration,_QScopedPointerDeleter<QSslConfiguration>_>::reset
              (&pQVar4->sslConfiguration,other);
  }
  local_58[0] = QNetworkReplyHttpImplPrivate::followRedirect;
  local_58[1] = (code *)0x0;
  QObjectPrivate::connect<void(QNetworkReply::*)(),void(QNetworkReplyHttpImplPrivate::*)()>
            ((Object *)local_a0,(offset_in_QNetworkReply_to_subr)this,
             (Object *)QNetworkReply::redirectAllowed,0,(ConnectionType)pQVar4);
  QMetaObject::Connection::~Connection((Connection *)local_a0);
  QIODevice::open(this,1);
  local_58[2] = (code *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58[0] = (code *)&DAT_aaaaaaaaaaaaaaaa;
  local_58[1] = (code *)&DAT_aaaaaaaaaaaaaaaa;
  local_78._0_8_ = (PrivateShared *)0x0;
  local_78._8_8_ = (char *)0x0;
  local_78._16_8_ = 0;
  local_60 = 2;
  QNetworkRequest::attribute
            ((QVariant *)local_58,request,SynchronousRequestAttribute,(QVariant *)local_78);
  QVariant::~QVariant((QVariant *)local_78);
  if (puStack_40 < (undefined1 *)0x4) {
LAB_001fc793:
    if (outgoingData != (QIODevice *)0x0) {
      cVar3 = (**(code **)(*(long *)pQVar4->outgoingData + 0x60))();
      if (cVar3 == '\0') {
LAB_001fc82b:
        member = "_q_startOperation";
      }
      else {
        this_00 = (QVariant *)(local_a0 + 8);
        QVariant::QVariant(this_00,false);
        QNetworkRequest::attribute
                  ((QVariant *)local_78,request,DoNotBufferUploadDataAttribute,this_00);
        cVar3 = QVariant::toBool();
        QVariant::~QVariant((QVariant *)local_78);
        QVariant::~QVariant(this_00);
        if (cVar3 != '\0') {
          QNetworkRequest::headers((QNetworkRequest *)local_78);
          QVar7 = QHttpHeaders::value((QHttpHeaders *)local_78,ContentLength,
                                      (QByteArrayView)ZEXT816(0));
          value.m_data = QVar7.m_data;
          value.m_size = (qsizetype)value.m_data;
          oVar8 = QNetworkHeadersPrivate::toInt((QNetworkHeadersPrivate *)QVar7.m_size,value);
          QHttpHeaders::~QHttpHeaders((QHttpHeaders *)local_78);
          if (((undefined1  [16])
               oVar8.super__Optional_base<long_long,_true,_true>._M_payload.
               super__Optional_payload_base<long_long> & (undefined1  [16])0x1) !=
              (undefined1  [16])0x0) goto LAB_001fc82b;
        }
        pQVar4->state = Buffering;
        member = "_q_bufferOutgoingData";
      }
      QMetaObject::invokeMethod<>((QObject *)this,member,QueuedConnection);
      goto LAB_001fc85a;
    }
  }
  else {
    bVar2 = (bool)QVariant::toBool();
    pQVar4->synchronous = bVar2;
    if (outgoingData == (QIODevice *)0x0 || bVar2 != true) goto LAB_001fc793;
    std::make_shared<QRingBuffer>();
    std::__shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(pQVar4->outgoingDataBuffer).
                super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>,
               (__shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2> *)local_78);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_78 + 8));
    peVar6 = (pQVar4->outgoingDataBuffer).
             super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    qVar5 = peVar6->bufferSize;
    do {
      QIODevice::readAll();
      QRingBuffer::append((QByteArray *)peVar6);
      QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)local_78);
      peVar6 = (pQVar4->outgoingDataBuffer).
               super___shared_ptr<QRingBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      bVar2 = peVar6->bufferSize != qVar5;
      qVar5 = peVar6->bufferSize;
    } while (bVar2);
  }
  QNetworkReplyHttpImplPrivate::_q_startOperation(pQVar4);
LAB_001fc85a:
  QVariant::~QVariant((QVariant *)local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QNetworkReplyHttpImpl::QNetworkReplyHttpImpl(QNetworkAccessManager* const manager,
                                             const QNetworkRequest& request,
                                             QNetworkAccessManager::Operation& operation,
                                             QIODevice* outgoingData)
    : QNetworkReply(*new QNetworkReplyHttpImplPrivate, manager)
{
    Q_D(QNetworkReplyHttpImpl);
    Q_ASSERT(manager);
    d->manager = manager;
    d->managerPrivate = manager->d_func();
    d->request = request;
    d->originalRequest = request;
    d->operation = operation;
    d->outgoingData = outgoingData;
    d->url = request.url();
#ifndef QT_NO_SSL
    if (request.url().scheme() == "https"_L1)
        d->sslConfiguration.reset(new QSslConfiguration(request.sslConfiguration()));
#endif

    QObjectPrivate::connect(this, &QNetworkReplyHttpImpl::redirectAllowed, d,
            &QNetworkReplyHttpImplPrivate::followRedirect, Qt::QueuedConnection);

    // FIXME Later maybe set to Unbuffered, especially if it is zerocopy or from cache?
    QIODevice::open(QIODevice::ReadOnly);


    // Internal code that does a HTTP reply for the synchronous Ajax
    // in Qt WebKit.
    QVariant synchronousHttpAttribute = request.attribute(
            static_cast<QNetworkRequest::Attribute>(QNetworkRequest::SynchronousRequestAttribute));
    if (synchronousHttpAttribute.isValid()) {
        d->synchronous = synchronousHttpAttribute.toBool();
        if (d->synchronous && outgoingData) {
            // The synchronous HTTP is a corner case, we will put all upload data in one big QByteArray in the outgoingDataBuffer.
            // Yes, this is not the most efficient thing to do, but on the other hand synchronous XHR needs to die anyway.
            d->outgoingDataBuffer = std::make_shared<QRingBuffer>();
            qint64 previousDataSize = 0;
            do {
                previousDataSize = d->outgoingDataBuffer->size();
                d->outgoingDataBuffer->append(d->outgoingData->readAll());
            } while (d->outgoingDataBuffer->size() != previousDataSize);
            d->_q_startOperation();
            return;
        }
    }


    if (outgoingData) {
        // there is data to be uploaded, e.g. HTTP POST.

        if (!d->outgoingData->isSequential()) {
            // fixed size non-sequential (random-access)
            // just start the operation
            QMetaObject::invokeMethod(this, "_q_startOperation", Qt::QueuedConnection);
            // FIXME make direct call?
        } else {
            bool bufferingDisallowed =
                    request.attribute(QNetworkRequest::DoNotBufferUploadDataAttribute,
                                  false).toBool();

            if (bufferingDisallowed) {
                // if a valid content-length header for the request was supplied, we can disable buffering
                // if not, we will buffer anyway

                const auto sizeOpt = QNetworkHeadersPrivate::toInt(
                        request.headers().value(QHttpHeaders::WellKnownHeader::ContentLength));
                 if (sizeOpt) {
                    QMetaObject::invokeMethod(this, "_q_startOperation", Qt::QueuedConnection);
                    // FIXME make direct call?
                } else {
                    d->state = d->Buffering;
                    QMetaObject::invokeMethod(this, "_q_bufferOutgoingData", Qt::QueuedConnection);
                }
            } else {
                // _q_startOperation will be called when the buffering has finished.
                d->state = d->Buffering;
                QMetaObject::invokeMethod(this, "_q_bufferOutgoingData", Qt::QueuedConnection);
            }
        }
    } else {
        // No outgoing data (POST, ..)
        d->_q_startOperation();
    }
}